

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  uchar *puVar2;
  bool bVar3;
  bool bVar4;
  stbtt_uint32 sVar5;
  long lVar6;
  int iVar7;
  uchar uVar8;
  uint uVar10;
  uint uVar12;
  undefined1 uVar9;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  stbtt__buf sVar33;
  stbtt__buf sVar34;
  stbtt__buf sVar35;
  stbtt__buf b;
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  undefined4 uVar36;
  uint uStack_210;
  uint uStack_20c;
  undefined4 in_stack_fffffffffffffe08;
  int iVar37;
  ulong uVar38;
  float local_1dc;
  undefined1 local_1d8 [16];
  float s [48];
  stbtt__buf subr_stack [10];
  
  sVar34 = info->subrs;
  sVar33 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar23 = sVar33._8_8_;
  uVar36 = sVar33.data._0_4_;
  iVar20 = sVar33.data._4_4_;
  uStack_20c = sVar33.size;
  if ((int)uStack_20c <= sVar33.cursor) {
switchD_0016a0d1_default:
    return 0;
  }
  bVar4 = true;
  iVar7 = 0;
  uVar38 = 0;
  iVar37 = 0;
  uVar13 = 0;
  local_1dc = (float)glyph_index;
LAB_00169d26:
  fVar24 = s[0xb];
  fVar32 = s[10];
  fVar28 = s[6];
  fVar31 = s[5];
  fVar30 = s[3];
  fVar25 = s[1];
  uVar10 = (uint)uVar23;
  uStack_210 = uVar10 + 1;
  bVar1 = *(byte *)(CONCAT44(iVar20,uVar36) + (long)(int)uVar10);
  uVar29 = (uint)uVar13;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    iVar7 = iVar7 + ((int)((int)(uVar13 >> 0x1f) + uVar29) >> 1);
    goto LAB_0016a929;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_00169d57_caseD_2:
    if (bVar1 < 0x20) {
      return 0;
    }
    if (bVar1 == 0xff) goto LAB_00169e59;
  case 0x1c:
    if ((int)uStack_20c < (int)uVar10) {
      uVar10 = uStack_20c;
    }
    bVar3 = (int)uStack_210 < 1;
    uStack_210 = uVar10;
    if (bVar3) {
      uStack_210 = uStack_20c;
    }
    sVar5 = stbtt__cff_int((stbtt__buf *)&stack0xfffffffffffffde8);
    fVar24 = (float)(int)(short)sVar5;
LAB_00169e99:
    if (0x2f < (int)uVar29) {
      return 0;
    }
    s[(int)uVar29] = fVar24;
    uVar14 = (ulong)(uVar29 + 1);
    break;
  case 4:
    if ((int)uVar29 < 1) {
      return 0;
    }
    fVar24 = s[uVar29 - 1];
    fVar25 = 0.0;
    goto LAB_0016a374;
  case 5:
    if ((int)uVar29 < 2) {
      return 0;
    }
    uVar23 = 1;
    do {
      fVar24 = s[uVar23];
      fVar25 = s[uVar23 - 1] + c->x;
      c->x = fVar25;
      fVar24 = fVar24 + c->y;
      c->y = fVar24;
      uVar14 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar25,(int)fVar24,0,0,0,0);
      uVar23 = uVar23 + 2;
    } while (uVar23 < uVar13);
    break;
  case 6:
    iVar15 = 0;
    if ((int)uVar29 < 1) {
      return 0;
    }
    for (; iVar15 < (int)uVar29; iVar15 = iVar15 + 1) {
      fVar24 = s[iVar15] + c->x;
      c->x = fVar24;
      fVar25 = c->y + 0.0;
      c->y = fVar25;
      stbtt__csctx_v(c,'\x02',(int)fVar24,(int)fVar25,0,0,0,0);
      iVar15 = iVar15 + 1;
LAB_0016a8d4:
      if ((int)uVar29 <= iVar15) break;
      fVar24 = s[iVar15];
      fVar25 = c->x + 0.0;
      c->x = fVar25;
      fVar24 = fVar24 + c->y;
      c->y = fVar24;
      stbtt__csctx_v(c,'\x02',(int)fVar25,(int)fVar24,0,0,0,0);
    }
    goto LAB_0016a929;
  case 7:
    iVar15 = 0;
    if (0 < (int)uVar29) goto LAB_0016a8d4;
    return 0;
  case 8:
    if ((int)uVar29 < 6) {
      return 0;
    }
    uVar23 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,*(float *)(local_1d8 + uVar23 * 4 + -4),s[uVar23 - 4],s[uVar23 - 3],s[uVar23 - 2]
                 ,s[uVar23 - 1],s[uVar23]);
      uVar23 = uVar23 + 6;
    } while (uVar23 < uVar13);
    goto LAB_0016a929;
  case 10:
    iVar15 = 1;
    if ((iVar37 == 0) && (uVar10 = (info->fdselect).size, uVar10 != 0)) {
      puVar2 = (info->fdselect).data;
      uVar8 = '\0';
      uVar12 = 0;
      if ((int)uVar10 < 0) {
        uVar12 = uVar10;
      }
      if (0 < (int)uVar10) {
        uVar8 = puVar2[uVar12];
        uVar12 = 1;
      }
      if (uVar8 == '\0') {
        uVar12 = uVar12 + (int)local_1dc;
        uVar16 = uVar12;
        if ((int)uVar10 < (int)uVar12) {
          uVar16 = uVar10;
        }
        if ((int)uVar12 < 0) {
          uVar16 = uVar10;
        }
        uVar11 = 0;
        if ((int)uVar16 < (int)uVar10) {
          uVar11 = (uint)puVar2[(int)uVar16];
        }
      }
      else {
        if (uVar8 == '\x03') {
          uVar16 = 0;
          iVar15 = 2;
          do {
            if ((int)uVar12 < (int)uVar10) {
              lVar18 = (long)(int)uVar12;
              uVar12 = uVar12 + 1;
              uVar11 = (uint)puVar2[lVar18];
            }
            else {
              uVar11 = 0;
            }
            uVar16 = uVar16 << 8 | uVar11;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          uVar17 = 0;
          iVar15 = 2;
          do {
            if ((int)uVar12 < (int)uVar10) {
              lVar18 = (long)(int)uVar12;
              uVar12 = uVar12 + 1;
              uVar11 = (uint)puVar2[lVar18];
            }
            else {
              uVar11 = 0;
            }
            uVar17 = uVar17 << 8 | uVar11;
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          if (0 < (int)uVar16) {
            uVar19 = 0;
            do {
              if ((int)uVar12 < (int)uVar10) {
                lVar18 = (long)(int)uVar12;
                uVar12 = uVar12 + 1;
                uVar11 = (uint)puVar2[lVar18];
              }
              else {
                uVar11 = 0;
              }
              uVar21 = 0;
              iVar15 = 2;
              do {
                if ((int)uVar12 < (int)uVar10) {
                  lVar18 = (long)(int)uVar12;
                  uVar12 = uVar12 + 1;
                  uVar22 = (uint)puVar2[lVar18];
                }
                else {
                  uVar22 = 0;
                }
                uVar21 = uVar21 << 8 | uVar22;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
              if ((int)local_1dc < (int)uVar21 && (int)uVar17 <= (int)local_1dc) goto LAB_0016a693;
              uVar19 = uVar19 + 1;
              uVar17 = uVar21;
            } while (uVar19 != uVar16);
          }
        }
        uVar11 = 0xffffffff;
      }
LAB_0016a693:
      stbtt__cff_index_get(info->fontdicts,uVar11);
      sVar34.data._4_4_ = in_stack_fffffffffffffde4;
      sVar34.data._0_4_ = in_stack_fffffffffffffde0;
      sVar34.cursor = uVar36;
      sVar34.size = iVar20;
      sVar33.data._4_4_ = iVar37;
      sVar33.data._0_4_ = in_stack_fffffffffffffe08;
      sVar33.cursor = (int)uVar38;
      sVar33.size = (int)(uVar38 >> 0x20);
      sVar34 = stbtt__get_subrs(sVar34,sVar33);
      iVar15 = 1;
    }
    goto LAB_0016a6cf;
  case 0xb:
    if ((int)uVar38 < 1) {
      return 0;
    }
    uVar38 = (ulong)((int)uVar38 - 1);
    uVar36 = *(undefined4 *)&subr_stack[uVar38].data;
    iVar20 = *(int *)((long)&subr_stack[uVar38].data + 4);
    uStack_210 = subr_stack[uVar38].cursor;
    uStack_20c = subr_stack[uVar38].size;
    uVar14 = uVar13;
    break;
  case 0xc:
    lVar18 = (long)(int)uStack_210;
    uVar9 = 0;
    if ((int)uStack_210 < (int)uStack_20c) {
      uStack_210 = uVar10 + 2;
      uVar9 = *(undefined1 *)(CONCAT44(iVar20,uVar36) + lVar18);
    }
    fVar27 = s[8];
    fVar26 = s[7];
    switch(uVar9) {
    case 0x22:
      if ((int)uVar29 < 7) {
        return 0;
      }
      local_1d8 = ZEXT416((uint)s[2]);
      fVar27 = s[5];
      fVar31 = s[4];
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar25 = -(float)local_1d8._0_4_;
      fVar26 = 0.0;
      fVar24 = 0.0;
      in_stack_fffffffffffffde0 = fVar27;
      in_stack_fffffffffffffde4 = fVar31;
      break;
    case 0x23:
      if ((int)uVar29 < 0xd) {
        return 0;
      }
      local_1d8._0_4_ = s[9];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar31 = fVar28;
      fVar25 = (float)local_1d8._0_4_;
      fVar28 = fVar32;
      in_stack_fffffffffffffde0 = fVar27;
      in_stack_fffffffffffffde4 = fVar26;
      break;
    case 0x24:
      if ((int)uVar29 < 9) {
        return 0;
      }
      local_1d8._0_4_ = s[7];
      fVar28 = s[8];
      fVar27 = s[6];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar24 = -(fVar25 + fVar30 + (float)local_1d8._0_4_);
      fVar26 = 0.0;
      fVar25 = (float)local_1d8._0_4_;
      in_stack_fffffffffffffde0 = fVar28;
      in_stack_fffffffffffffde4 = fVar27;
      break;
    case 0x25:
      if ((int)uVar29 < 0xb) {
        return 0;
      }
      fVar30 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar31 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar25 = ABS(fVar30);
      fVar32 = ABS(fVar31);
      local_1d8._0_4_ = s[9];
      fVar24 = s[10];
      if (fVar32 < fVar25) {
        fVar24 = -fVar31;
      }
      uVar10 = -(uint)(fVar32 < fVar25);
      uVar29 = (uint)s[10] & uVar10;
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar31 = fVar28;
      fVar25 = (float)local_1d8._0_4_;
      fVar28 = (float)(~uVar10 & (uint)-fVar30 | uVar29);
      in_stack_fffffffffffffde0 = fVar27;
      in_stack_fffffffffffffde4 = fVar26;
      break;
    default:
      goto switchD_0016a0d1_default;
    }
    goto LAB_0016a07a;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar4) {
      iVar7 = iVar7 + ((int)((int)(uVar13 >> 0x1f) + uVar29) >> 1);
    }
    iVar15 = iVar7 + 0xe;
    if (-1 < iVar7 + 7) {
      iVar15 = iVar7 + 7;
    }
    uVar10 = (iVar15 >> 3) + uStack_210;
    uStack_210 = uVar10;
    if ((int)uStack_20c < (int)uVar10) {
      uStack_210 = uStack_20c;
    }
    if ((int)uVar10 < 0) {
      uStack_210 = uStack_20c;
    }
    goto LAB_0016a3aa;
  case 0x15:
    if ((int)uVar29 < 2) {
      return 0;
    }
    fVar25 = s[uVar29 - 2];
    fVar24 = s[uVar29 - 1];
    goto LAB_0016a374;
  case 0x16:
    if ((int)uVar29 < 1) {
      return 0;
    }
    fVar25 = s[uVar29 - 1];
    fVar24 = 0.0;
LAB_0016a374:
    stbtt__csctx_rmove_to(c,fVar25,fVar24);
LAB_0016a3aa:
    bVar4 = false;
    uVar14 = 0;
    break;
  case 0x18:
    if ((int)uVar29 < 8) {
      return 0;
    }
    lVar18 = -6;
    do {
      lVar6 = lVar18;
      stbtt__csctx_rccurve_to
                (c,s[lVar6 + 6],s[lVar6 + 7],s[lVar6 + 8],s[lVar6 + 9],s[lVar6 + 10],s[lVar6 + 0xb])
      ;
      lVar18 = lVar6 + 6;
    } while (lVar6 + 6 < (long)(int)uVar29 + -0xd);
    if ((int)uVar29 <= (int)lVar6 + 0xd) {
      return 0;
    }
    fVar24 = s[lVar6 + 0xd];
    fVar25 = s[lVar6 + 0xc] + c->x;
    c->x = fVar25;
    fVar24 = fVar24 + c->y;
    c->y = fVar24;
    stbtt__csctx_v(c,'\x02',(int)fVar25,(int)fVar24,0,0,0,0);
    uVar14 = 0;
    break;
  case 0x19:
    if ((int)uVar29 < 8) {
      return 0;
    }
    lVar18 = 5;
    do {
      lVar6 = lVar18;
      fVar24 = s[lVar6 + -4];
      fVar25 = *(float *)(local_1d8 + lVar6 * 4 + -4) + c->x;
      c->x = fVar25;
      fVar24 = fVar24 + c->y;
      c->y = fVar24;
      stbtt__csctx_v(c,'\x02',(int)fVar25,(int)fVar24,0,0,0,0);
      lVar18 = lVar6 + 2;
    } while (lVar6 + -2 < (long)(int)(uVar29 - 6));
    if ((int)uVar29 <= (int)lVar18) {
      return 0;
    }
    fVar26 = s[lVar6 + -2];
    fVar27 = s[lVar6 + -1];
    fVar24 = s[lVar18];
    fVar31 = *(float *)(local_1d8 + lVar18 * 4 + -4);
    fVar25 = s[lVar6];
    fVar28 = s[lVar6 + 1];
LAB_0016a07a:
    stbtt__csctx_rccurve_to(c,fVar31,fVar26,fVar27,fVar25,fVar28,fVar24);
    goto LAB_0016a929;
  case 0x1a:
  case 0x1b:
    if ((int)uVar29 < 4) {
      return 0;
    }
    uVar23 = (ulong)(uVar29 & 1);
    if ((int)((uVar29 & 1) + 3) < (int)uVar29) {
      fVar24 = 0.0;
      if ((uVar13 & 1) != 0) {
        fVar24 = s[0];
      }
      do {
        iVar15 = (int)uVar23;
        fVar25 = s[uVar23];
        fVar30 = s[iVar15 + 3];
        if (bVar1 == 0x1b) {
          fVar31 = fVar25;
          fVar25 = fVar24;
          fVar28 = fVar30;
          fVar30 = 0.0;
        }
        else {
          fVar28 = 0.0;
          fVar31 = fVar24;
        }
        stbtt__csctx_rccurve_to(c,fVar31,fVar25,s[uVar23 + 1],s[uVar23 + 2],fVar28,fVar30);
        uVar23 = uVar23 + 4;
        fVar24 = 0.0;
      } while (iVar15 + 7 < (int)uVar29);
    }
    goto LAB_0016a929;
  case 0x1d:
    iVar15 = iVar37;
LAB_0016a6cf:
    if ((int)uVar29 < 1) {
      return 0;
    }
    iVar37 = (int)uVar38;
    if (9 < iVar37) {
      return 0;
    }
    fVar24 = s[uVar29 - 1];
    *(undefined4 *)&subr_stack[iVar37].data = uVar36;
    *(int *)((long)&subr_stack[iVar37].data + 4) = iVar20;
    subr_stack[iVar37].cursor = uStack_210;
    subr_stack[iVar37].size = uStack_20c;
    sVar33 = sVar34;
    if (bVar1 != 10) {
      sVar33 = info->gsubrs;
    }
    b.data = sVar33.data;
    uVar38 = (ulong)(iVar37 + 1);
    uVar12 = sVar33.size;
    uVar16 = (int)uVar12 >> 0x1f & uVar12;
    uVar10 = 0;
    iVar20 = 2;
    do {
      if ((int)uVar16 < (int)uVar12) {
        lVar18 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        uVar11 = (uint)b.data[lVar18];
      }
      else {
        uVar11 = 0;
      }
      uVar10 = uVar10 << 8 | uVar11;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
    uVar12 = (uint)(0x4d7 < (int)uVar10) << 10 | 0x6b;
    if (0x846b < (int)uVar10) {
      uVar12 = 0x8000;
    }
    iVar20 = uVar12 + (int)fVar24;
    sVar35 = (stbtt__buf)ZEXT816(0);
    if (iVar20 < (int)uVar10 && -1 < iVar20) {
      b._8_8_ = (ulong)uVar16 | sVar33._8_8_ & 0xffffffff00000000;
      sVar35 = stbtt__cff_index_get(b,iVar20);
    }
    uVar36 = sVar35.data._0_4_;
    iVar20 = sVar35.data._4_4_;
    uStack_20c = sVar35.size;
    if (uStack_20c == 0) {
      return 0;
    }
    uStack_210 = 0;
    uVar14 = (ulong)(uVar29 - 1);
    iVar37 = iVar15;
    break;
  case 0x1e:
    iVar15 = 0;
    if ((int)uVar29 < 4) {
      return 0;
    }
    for (; iVar15 + 3 < (int)uVar29; iVar15 = iVar15 + 4) {
      fVar24 = 0.0;
      if (uVar29 - iVar15 == 5) {
        fVar24 = s[(long)iVar15 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar15],s[(long)iVar15 + 1],s[(long)iVar15 + 2],s[iVar15 + 3],fVar24);
      iVar15 = iVar15 + 4;
LAB_0016a830:
      if ((int)uVar29 <= iVar15 + 3) break;
      fVar24 = 0.0;
      if (uVar29 - iVar15 == 5) {
        fVar24 = s[(long)iVar15 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar15],0.0,s[(long)iVar15 + 1],s[(long)iVar15 + 2],fVar24,s[iVar15 + 3]);
    }
LAB_0016a929:
    uVar14 = 0;
    break;
  case 0x1f:
    iVar15 = 0;
    if (3 < (int)uVar29) goto LAB_0016a830;
    return 0;
  default:
    if (bVar1 != 0xff) goto switchD_00169d57_caseD_2;
LAB_00169e59:
    uVar10 = 0;
    iVar15 = 4;
    do {
      if ((int)uStack_210 < (int)uStack_20c) {
        lVar18 = (long)(int)uStack_210;
        uStack_210 = uStack_210 + 1;
        uVar12 = (uint)*(byte *)(CONCAT44(iVar20,uVar36) + lVar18);
      }
      else {
        uVar12 = 0;
      }
      uVar10 = uVar10 << 8 | uVar12;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    fVar24 = (float)(int)uVar10 * 1.5258789e-05;
    goto LAB_00169e99;
  }
  uVar23 = (ulong)uStack_210;
  uVar13 = uVar14;
  if ((int)uStack_20c <= (int)uStack_210) {
    return 0;
  }
  goto LAB_00169d26;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254))
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}